

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting
          (OptionInterpreter *this,UninterpretedOption *uninterpreted_option,Message *options)

{
  int iVar1;
  undefined4 extraout_var;
  FieldDescriptor *field;
  LogMessage *other;
  Message *pMVar2;
  Reflection *this_00;
  allocator local_59;
  LogMessage local_58;
  
  iVar1 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  std::__cxx11::string::string((string *)&local_58,"uninterpreted_option",&local_59);
  field = Descriptor::FindFieldByName
                    ((Descriptor *)CONCAT44(extraout_var,iVar1),(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (field == (FieldDescriptor *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x19f3);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: field != nullptr: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  pMVar2 = Reflection::AddMessage(this_00,options,field,(MessageFactory *)0x0);
  (*(pMVar2->super_MessageLite)._vptr_MessageLite[0x10])(pMVar2,uninterpreted_option);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::AddWithoutInterpreting(
    const UninterpretedOption& uninterpreted_option, Message* options) {
  const FieldDescriptor* field =
      options->GetDescriptor()->FindFieldByName("uninterpreted_option");
  GOOGLE_CHECK(field != nullptr);

  options->GetReflection()
      ->AddMessage(options, field)
      ->CopyFrom(uninterpreted_option);
}